

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intCheck.c
# Opt level: O1

void Inter_CheckStop(Inter_Check_t *p)

{
  Vec_Int_t *pVVar1;
  
  if (p != (Inter_Check_t *)0x0) {
    pVVar1 = p->vOrLits;
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (int *)0x0;
    }
    if (pVVar1 != (Vec_Int_t *)0x0) {
      free(pVVar1);
    }
    pVVar1 = p->vAndLits;
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (int *)0x0;
    }
    if (pVVar1 != (Vec_Int_t *)0x0) {
      free(pVVar1);
    }
    pVVar1 = p->vAssLits;
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (int *)0x0;
    }
    if (pVVar1 != (Vec_Int_t *)0x0) {
      free(pVVar1);
    }
    Cnf_DataFree(p->pCnf);
    Aig_ManStop(p->pFrames);
    sat_solver_delete(p->pSat);
    free(p);
    return;
  }
  return;
}

Assistant:

void Inter_CheckStop( Inter_Check_t * p )
{
    if ( p == NULL )
        return;
    Vec_IntFree( p->vOrLits );
    Vec_IntFree( p->vAndLits );
    Vec_IntFree( p->vAssLits );
    Cnf_DataFree( p->pCnf );
    Aig_ManStop( p->pFrames );
    sat_solver_delete( p->pSat );
    ABC_FREE( p );
}